

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

void __thiscall cfd::core::SchnorrPubkey::SchnorrPubkey(SchnorrPubkey *this,ByteData *data)

{
  bool bVar1;
  size_t sVar2;
  CfdException *pCVar3;
  allocator local_d1;
  string local_d0;
  ByteData256 local_b0;
  undefined1 local_92;
  allocator local_91;
  string local_90;
  ByteData local_70;
  Pubkey local_58;
  undefined1 local_40 [8];
  SchnorrPubkey pk;
  ByteData *data_local;
  SchnorrPubkey *this_local;
  
  ByteData256::ByteData256(&this->data_);
  bVar1 = Pubkey::IsValid(data);
  if (bVar1) {
    ByteData::ByteData(&local_70,data);
    Pubkey::Pubkey(&local_58,&local_70);
    FromPubkey((SchnorrPubkey *)local_40,&local_58,(bool *)0x0);
    Pubkey::~Pubkey(&local_58);
    ByteData::~ByteData(&local_70);
    ByteData256::operator=(&this->data_,(ByteData256 *)local_40);
    ~SchnorrPubkey((SchnorrPubkey *)local_40);
  }
  else {
    sVar2 = ByteData::GetDataSize(data);
    if (sVar2 != 0x20) {
      local_92 = 1;
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,"Invalid Schnorr pubkey length.",&local_91)
      ;
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_90);
      local_92 = 0;
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData256::ByteData256(&local_b0,data);
    ByteData256::operator=(&this->data_,&local_b0);
    ByteData256::~ByteData256(&local_b0);
    bVar1 = ByteData256::IsEmpty(&this->data_);
    if (bVar1) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_d0,"Invalid Schnorr pubkey data.",&local_d1);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_d0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

SchnorrPubkey::SchnorrPubkey(const ByteData &data) : data_() {
  if (Pubkey::IsValid(data)) {
    auto pk = SchnorrPubkey::FromPubkey(Pubkey(data));
    data_ = pk.data_;
  } else {
    if (data.GetDataSize() != SchnorrPubkey::kSchnorrPubkeySize) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid Schnorr pubkey length.");
    }
    data_ = ByteData256(data);
    if (data_.IsEmpty()) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid Schnorr pubkey data.");
    }
  }
}